

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

size_t arm_Convert(_7zip *zip,uint8_t *buf,size_t size)

{
  uint uVar1;
  size_t sStack_28;
  uint32_t addr;
  size_t i;
  size_t size_local;
  uint8_t *buf_local;
  _7zip *zip_local;
  
  for (sStack_28 = 0; sStack_28 + 4 <= size; sStack_28 = sStack_28 + 4) {
    if (buf[sStack_28 + 3] == 0xeb) {
      uVar1 = (uint)CONCAT12(buf[sStack_28 + 2],CONCAT11(buf[sStack_28 + 1],buf[sStack_28])) * 4 -
              (zip->bcj_ip + (int)sStack_28) >> 2;
      buf[sStack_28] = (uint8_t)uVar1;
      buf[sStack_28 + 1] = (uint8_t)(uVar1 >> 8);
      buf[sStack_28 + 2] = (uint8_t)(uVar1 >> 0x10);
    }
  }
  zip->bcj_ip = (int)sStack_28 + zip->bcj_ip;
  return sStack_28;
}

Assistant:

static size_t
arm_Convert(struct _7zip *zip, uint8_t *buf, size_t size)
{
	// This function was adapted from
	// static size_t bcj_arm(struct xz_dec_bcj *s, uint8_t *buf, size_t size)
	// in https://git.tukaani.org/xz-embedded.git

	/*
	 * Branch/Call/Jump (BCJ) filter decoders
	 *
	 * Authors: Lasse Collin <lasse.collin@tukaani.org>
	 *          Igor Pavlov <https://7-zip.org/>
	 *
	 * This file has been put into the public domain.
	 * You can do whatever you want with this file.
	 */

	size_t i;
	uint32_t addr;

	for (i = 0; i + 4 <= size; i += 4) {
		if (buf[i + 3] == 0xEB) {
			// Calculate the transformed addr.
			addr = (uint32_t)buf[i] | ((uint32_t)buf[i + 1] << 8)
				| ((uint32_t)buf[i + 2] << 16);
			addr <<= 2;
			addr -= zip->bcj_ip + (uint32_t)i;
			addr >>= 2;

			// Store the transformed addr in buf.
			buf[i] = (uint8_t)addr;
			buf[i + 1] = (uint8_t)(addr >> 8);
			buf[i + 2] = (uint8_t)(addr >> 16);
		}
	}

	zip->bcj_ip += (uint32_t)i;

	return i;
}